

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O2

void __thiscall TypeChecker::visit(TypeChecker *this,BinaryOpNode *node)

{
  ExpressionNode *pEVar1;
  int iVar2;
  uint uVar3;
  mapped_type *pmVar4;
  _Optional_payload_base<TypeName> _Var5;
  optional<TypeName> leftType;
  optional<TypeName> rightType;
  TypeChecker checker;
  undefined8 local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined8 local_40;
  undefined **local_38;
  int local_30;
  uint uStack_2c;
  SymbolTable *local_28;
  
  local_28 = this->symbols_;
  local_38 = &PTR__Visitor_001d0488;
  uStack_2c = uStack_2c & 0xffffff00;
  pEVar1 = (node->leftOperand_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_38);
  uVar3 = uStack_2c;
  iVar2 = local_30;
  local_88 = CONCAT44(uStack_2c,local_30);
  pEVar1 = (node->rightOperand_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_38);
  local_40 = CONCAT44(uStack_2c,local_30);
  if ((uStack_2c & 1) == 0 || (uVar3 & 1) == 0) {
    _Var5._M_payload = (_Storage<TypeName,_true>)0x0;
    _Var5._M_engaged = false;
    _Var5._5_3_ = 0;
  }
  else {
    _Var5._M_payload = (_Storage<TypeName,_true>)0x0;
    _Var5._M_engaged = true;
    _Var5._5_3_ = 0;
    if (iVar2 == 0) {
      if (local_30 != 0) goto LAB_00145b88;
    }
    else {
      if (iVar2 != 3) {
LAB_00145b88:
        pmVar4 = std::__detail::
                 _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&TypeNameStrings_abi_cxx11_,(key_type *)&local_88);
        std::operator+(&local_80,"Invalid operation on value of type ",pmVar4);
        std::operator+(&local_60,&local_80,"!");
        reportError(&local_60,(Node *)node);
      }
      if (node->operator_ != Addition) {
        pmVar4 = std::__detail::
                 _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&TypeNameStrings_abi_cxx11_,(key_type *)&local_88);
        std::operator+(&local_80,"Invalid operation on value of type ",pmVar4);
        std::operator+(&local_60,&local_80,"!");
        reportError(&local_60,(Node *)node);
      }
      _Var5._M_payload = (_Storage<TypeName,_true>)0x3;
      _Var5._M_engaged = true;
      _Var5._5_3_ = 0;
      if ((local_30 != 0) && (local_30 != 3)) {
        pmVar4 = std::__detail::
                 _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&TypeNameStrings_abi_cxx11_,(key_type *)&local_40);
        std::operator+(&local_80,"Cannot concatenate string with ",pmVar4);
        std::operator+(&local_60,&local_80,"!");
        reportError(&local_60,(Node *)node);
      }
    }
  }
  (this->type_).super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName> = _Var5;
  return;
}

Assistant:

void TypeChecker::visit(const BinaryOpNode& node)
{
  TypeChecker checker{symbols_};
  node.getLeftOperand().accept(checker);  
  auto leftType = checker.getType();

  node.getRightOperand().accept(checker);
  auto rightType = checker.getType();

  if(!leftType.has_value() || !rightType.has_value())
    type_ = {};
  else if(leftType == TypeName::String)
  {
    if(node.getOperation() != BinaryOperator::Addition)
      reportError("Invalid operation on value of type " + 
        TypeNameStrings.at(leftType.value()) + "!", node);
    else if(rightType != TypeName::F32 && rightType != TypeName::String)
      reportError("Cannot concatenate string with " +
        TypeNameStrings.at(rightType.value()) + "!", node);

    type_ = TypeName::String;
  }
  else if(leftType == TypeName::F32 && rightType == TypeName::F32)
    type_ = TypeName::F32;
  else
    reportError("Invalid operation on value of type " + 
        TypeNameStrings.at(leftType.value()) + "!", node);
}